

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::update
          (CRotationZ<std::complex<float>_> *this,rotation_type *rot)

{
  RotationZ<std::complex<float>_> *pRVar1;
  char cVar2;
  
  pRVar1 = (this->gate_)._M_t.
           super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
           .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_false>.
           _M_head_impl;
  cVar2 = (**(code **)(*(long *)&(pRVar1->super_QRotationGate1<std::complex<float>_>).
                                 super_QGate1<std::complex<float>_> + 8))(pRVar1);
  if (cVar2 == '\0') {
    (pRVar1->super_QRotationGate1<std::complex<float>_>).rotation_.angle_ = rot->angle_;
    return;
  }
  __assert_fail("!fixed()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QRotationGate1.hpp"
                ,0x78,
                "void qclab::qgates::QRotationGate1<std::complex<float>>::update(const rotation_type &) [T = std::complex<float>]"
               );
}

Assistant:

void update( const rotation_type& rot ) { gate_->update( rot ) ; }